

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Gluco::Heap<Gluco::SimpSolver::ElimLt>::insert(Heap<Gluco::SimpSolver::ElimLt> *this,int n)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int local_18;
  int local_14;
  Heap<Gluco::SimpSolver::ElimLt> *pHStack_10;
  int n_local;
  Heap<Gluco::SimpSolver::ElimLt> *this_local;
  
  local_18 = -1;
  local_14 = n;
  pHStack_10 = this;
  vec<int>::growTo(&this->indices,n + 1,&local_18);
  bVar1 = inHeap(this,local_14);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!inHeap(n)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Heap.h"
                  ,0x68,
                  "void Gluco::Heap<Gluco::SimpSolver::ElimLt>::insert(int) [Comp = Gluco::SimpSolver::ElimLt]"
                 );
  }
  iVar2 = vec<int>::size(&this->heap);
  piVar3 = vec<int>::operator[](&this->indices,local_14);
  *piVar3 = iVar2;
  vec<int>::push(&this->heap,&local_14);
  piVar3 = vec<int>::operator[](&this->indices,local_14);
  percolateUp(this,*piVar3);
  return;
}

Assistant:

void insert(int n)
    {
        indices.growTo(n+1, -1);
        assert(!inHeap(n));

        indices[n] = heap.size();
        heap.push(n);
        percolateUp(indices[n]); 
    }